

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall front::irGenerator::irGenerator::pushWhile(irGenerator *this,WhileLabels wl)

{
  pointer *ppWVar1;
  iterator __position;
  WhileLabels local_8;
  
  __position._M_current =
       (this->_whileStack).
       super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_whileStack).
      super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = wl;
    std::vector<front::irGenerator::WhileLabels,std::allocator<front::irGenerator::WhileLabels>>::
    _M_realloc_insert<front::irGenerator::WhileLabels_const&>
              ((vector<front::irGenerator::WhileLabels,std::allocator<front::irGenerator::WhileLabels>>
                *)&this->_whileStack,__position,&local_8);
  }
  else {
    *__position._M_current = wl;
    ppWVar1 = &(this->_whileStack).
               super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppWVar1 = *ppWVar1 + 1;
  }
  return;
}

Assistant:

void irGenerator::pushWhile(WhileLabels wl) { _whileStack.push_back(wl); }